

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void RAWToARGBRow_C(uint8_t *src_raw,uint8_t *dst_argb,int width)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t b;
  uint8_t g;
  uint8_t r;
  int x;
  int width_local;
  uint8_t *dst_argb_local;
  uint8_t *src_raw_local;
  
  dst_argb_local = dst_argb;
  src_raw_local = src_raw;
  for (x = 0; x < width; x = x + 1) {
    uVar1 = *src_raw_local;
    uVar2 = src_raw_local[1];
    *dst_argb_local = src_raw_local[2];
    dst_argb_local[1] = uVar2;
    dst_argb_local[2] = uVar1;
    dst_argb_local[3] = 0xff;
    dst_argb_local = dst_argb_local + 4;
    src_raw_local = src_raw_local + 3;
  }
  return;
}

Assistant:

void RAWToARGBRow_C(const uint8_t* src_raw, uint8_t* dst_argb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t r = src_raw[0];
    uint8_t g = src_raw[1];
    uint8_t b = src_raw[2];
    dst_argb[0] = b;
    dst_argb[1] = g;
    dst_argb[2] = r;
    dst_argb[3] = 255u;
    dst_argb += 4;
    src_raw += 3;
  }
}